

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  int iVar1;
  uchar *in_RDX;
  uchar **in_RSI;
  secp256k1_scalar *in_RDI;
  int rlen;
  uchar ra [32];
  int overflow;
  uint in_stack_ffffffffffffffb0;
  uint uVar2;
  uchar *in_stack_ffffffffffffffb8;
  secp256k1_scalar *in_stack_ffffffffffffffc0;
  undefined1 auStack_28 [4];
  int local_24;
  uchar *local_20;
  uchar **local_18;
  secp256k1_scalar *local_10;
  int local_4;
  
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffb8,0,0x20);
  if ((*local_18 == local_20) || (**local_18 != '\x02')) {
    local_4 = 0;
  }
  else {
    *local_18 = *local_18 + 1;
    iVar1 = secp256k1_der_read_len(local_18,local_20);
    if ((iVar1 < 1) || (local_20 < *local_18 + iVar1)) {
      local_4 = 0;
    }
    else if (((**local_18 == '\0') && (1 < iVar1)) && (((*local_18)[1] & 0x80) == 0)) {
      local_4 = 0;
    }
    else if (((**local_18 == 0xff) && (1 < iVar1)) && (((*local_18)[1] & 0x80) == 0x80)) {
      local_4 = 0;
    }
    else {
      if ((**local_18 & 0x80) == 0x80) {
        local_24 = 1;
      }
      while( true ) {
        uVar2 = in_stack_ffffffffffffffb0 & 0xffffff;
        if (0 < iVar1) {
          uVar2 = CONCAT13(**local_18 == '\0',(int3)in_stack_ffffffffffffffb0);
        }
        if ((char)(uVar2 >> 0x18) == '\0') break;
        iVar1 = iVar1 + -1;
        *local_18 = *local_18 + 1;
        in_stack_ffffffffffffffb0 = uVar2;
      }
      if (0x20 < iVar1) {
        local_24 = 1;
      }
      if (local_24 == 0) {
        memcpy(auStack_28 + -(long)iVar1,*local_18,(long)iVar1);
        secp256k1_scalar_set_b32
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int *)CONCAT44(iVar1,uVar2))
        ;
      }
      if (local_24 != 0) {
        secp256k1_scalar_set_int(local_10,0);
      }
      *local_18 = *local_18 + iVar1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    int rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    rlen = secp256k1_der_read_len(sig, sigend);
    if (rlen <= 0 || (*sig) + rlen > sigend) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    while (rlen > 0 && **sig == 0) {
        /* Skip leading zero bytes */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}